

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

qpTestResult __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::ValidateFramebuffer
          (ClipControlDepthModeZeroToOneTest *this,Context *context)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *this_00;
  float fVar5;
  PixelBufferAccess local_218;
  undefined4 local_1ec;
  PixelBufferAccess local_1e8;
  PixelBufferAccess local_1c0;
  deUint32 local_194;
  PixelBufferAccess local_190;
  deUint32 local_164;
  PixelBufferAccess local_160;
  PixelBufferAccess local_138;
  float local_10c;
  int local_108;
  float xCoord;
  int x;
  float yCoord;
  int y;
  float rasterizationError;
  TestLog *log;
  TextureLevel importanceMaskFrame;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  TextureFormat depthFormat;
  undefined1 local_60 [8];
  Surface referenceColorFrame;
  Surface renderedColorFrame;
  GLuint viewportH;
  GLuint viewportW;
  RenderTarget *renderTarget;
  Context *context_local;
  ClipControlDepthModeZeroToOneTest *this_local;
  
  pRVar4 = deqp::Context::getRenderContext(context);
  iVar2 = (*pRVar4->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar2));
  iVar2 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar2));
  tcu::Surface::Surface((Surface *)&referenceColorFrame.m_pixels.m_cap,iVar3,iVar2);
  tcu::Surface::Surface((Surface *)local_60,iVar3,iVar2);
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),D,FLOAT);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&referenceDepthFrame.m_data.m_cap,
             (TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),iVar3,iVar2,1);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&importanceMaskFrame.m_data.m_cap,
             (TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),iVar3,iVar2,1);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&log,(TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),
             iVar3,iVar2,1);
  this_00 = deqp::Context::getTestContext(context);
  _y = tcu::TestContext::getLog(this_00);
  iVar2 = tcu::Surface::getHeight((Surface *)&referenceColorFrame.m_pixels.m_cap);
  iVar3 = tcu::Surface::getWidth((Surface *)&referenceColorFrame.m_pixels.m_cap);
  yCoord = 2.0 / (float)iVar2 + 2.0 / (float)iVar3;
  x = 0;
  while( true ) {
    iVar2 = x;
    iVar3 = tcu::Surface::getHeight((Surface *)&referenceColorFrame.m_pixels.m_cap);
    if (iVar3 <= iVar2) break;
    fVar5 = (float)x;
    iVar2 = tcu::Surface::getHeight((Surface *)&referenceColorFrame.m_pixels.m_cap);
    xCoord = (fVar5 + 0.5) / (float)iVar2;
    local_108 = 0;
    while( true ) {
      iVar2 = local_108;
      iVar3 = tcu::Surface::getWidth((Surface *)&referenceColorFrame.m_pixels.m_cap);
      if (iVar3 <= iVar2) break;
      fVar5 = (float)local_108;
      iVar2 = tcu::Surface::getWidth((Surface *)&referenceColorFrame.m_pixels.m_cap);
      local_10c = (fVar5 + 0.5) / (float)iVar2;
      if ((xCoord < (1.0 - local_10c) - yCoord) || ((1.0 - local_10c) + yCoord < xCoord)) {
        tcu::TextureLevel::getAccess(&local_160,(TextureLevel *)&log);
        tcu::PixelBufferAccess::setPixDepth(&local_160,1.0,local_108,x,0);
      }
      else {
        tcu::TextureLevel::getAccess(&local_138,(TextureLevel *)&log);
        tcu::PixelBufferAccess::setPixDepth(&local_138,0.0,local_108,x,0);
      }
      iVar3 = x;
      iVar2 = local_108;
      if (1.0 - local_10c <= xCoord) {
        local_194 = (deUint32)tcu::RGBA::green();
        tcu::Surface::setPixel((Surface *)local_60,iVar2,iVar3,(RGBA)local_194);
        tcu::TextureLevel::getAccess(&local_1c0,(TextureLevel *)&importanceMaskFrame.m_data.m_cap);
        tcu::PixelBufferAccess::setPixDepth(&local_1c0,local_10c + -1.0 + xCoord,local_108,x,0);
      }
      else {
        local_164 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_60,iVar2,iVar3,(RGBA)local_164);
        tcu::TextureLevel::getAccess(&local_190,(TextureLevel *)&importanceMaskFrame.m_data.m_cap);
        tcu::PixelBufferAccess::setPixDepth(&local_190,0.5,local_108,x,0);
      }
      local_108 = local_108 + 1;
    }
    x = x + 1;
  }
  pRVar4 = deqp::Context::getRenderContext(context);
  tcu::Surface::getAccess(&local_1e8,(Surface *)&referenceColorFrame.m_pixels.m_cap);
  glu::readPixels(pRVar4,0,0,&local_1e8);
  bVar1 = tcu::fuzzyCompare(_y,"Result","Color image comparison result",(Surface *)local_60,
                            (Surface *)&referenceColorFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  if (bVar1) {
    pRVar4 = deqp::Context::getRenderContext(context);
    tcu::TextureLevel::getAccess(&local_218,(TextureLevel *)&referenceDepthFrame.m_data.m_cap);
    glu::readPixels(pRVar4,0,0,&local_218);
    bVar1 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&this->super_ClipControlRenderBaseTest,_y,"Result",
                       "Depth image comparison result",
                       (TextureLevel *)&importanceMaskFrame.m_data.m_cap,
                       (TextureLevel *)&referenceDepthFrame.m_data.m_cap,0.05,(TextureLevel *)&log);
    if (bVar1) {
      this_local._4_4_ = QP_TEST_RESULT_PASS;
    }
    else {
      this_local._4_4_ = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_local._4_4_ = QP_TEST_RESULT_FAIL;
  }
  local_1ec = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&log);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&importanceMaskFrame.m_data.m_cap);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&referenceDepthFrame.m_data.m_cap);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceColorFrame.m_pixels.m_cap);
  return this_local._4_4_;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 importanceMaskFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		const float rasterizationError =
			2.0f / (float)renderedColorFrame.getHeight() + 2.0f / (float)renderedColorFrame.getWidth();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = ((float)(y) + 0.5f) / (float)renderedColorFrame.getHeight();

			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = ((float)(x) + 0.5f) / (float)renderedColorFrame.getWidth();

				if (yCoord >= 1.0 - xCoord - rasterizationError && yCoord <= 1.0 - xCoord + rasterizationError)
				{
					importanceMaskFrame.getAccess().setPixDepth(0.0f, x, y);
				}
				else
				{
					importanceMaskFrame.getAccess().setPixDepth(1.0f, x, y);
				}

				if (yCoord < 1.0 - xCoord)
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::red());
					referenceDepthFrame.getAccess().setPixDepth(0.5f, x, y);
				}
				else
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::green());

					referenceDepthFrame.getAccess().setPixDepth(-1.0f + xCoord + yCoord, x, y);
				}
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f, &importanceMaskFrame))
		{
			return QP_TEST_RESULT_FAIL;
		}
		return QP_TEST_RESULT_PASS;
	}